

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 * COVER_map_at(COVER_map_t *map,U32 key)

{
  long lVar1;
  U32 UVar2;
  undefined4 *puVar3;
  undefined4 in_ESI;
  long *in_RDI;
  COVER_map_pair_t *pos;
  COVER_map_t *in_stack_ffffffffffffffe8;
  
  lVar1 = *in_RDI;
  UVar2 = COVER_map_index(in_stack_ffffffffffffffe8,(U32)((ulong)lVar1 >> 0x20));
  puVar3 = (undefined4 *)(lVar1 + (ulong)UVar2 * 8);
  if (puVar3[1] == -1) {
    *puVar3 = in_ESI;
    puVar3[1] = 0;
  }
  return puVar3 + 1;
}

Assistant:

static U32 *COVER_map_at(COVER_map_t *map, U32 key) {
  COVER_map_pair_t *pos = &map->data[COVER_map_index(map, key)];
  if (pos->value == MAP_EMPTY_VALUE) {
    pos->key = key;
    pos->value = 0;
  }
  return &pos->value;
}